

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall
QMainWindowLayout::addToolBar
          (QMainWindowLayout *this,ToolBarArea area,QToolBar *toolbar,bool param_4)

{
  byte bVar1;
  bool bVar2;
  ToolBarArea area_00;
  QLayoutItem *pQVar3;
  byte in_CL;
  QWidget *in_RDX;
  ToolBarArea in_ESI;
  QLayoutItem *in_RDI;
  QLayoutItem *item;
  DockPosition in_stack_ffffffffffffffbc;
  undefined2 uVar4;
  QToolBarPrivate *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = in_CL & 1;
  area_00 = validateToolBarArea(in_ESI);
  QLayout::addChildWidget((QLayout *)CONCAT44(area_00,in_stack_fffffffffffffff0),in_RDX);
  toDockPos(area_00);
  pQVar3 = QToolBarAreaLayout::addToolBar
                     ((QToolBarAreaLayout *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                      (QToolBar *)0x5f6132);
  uVar4 = (undefined2)(in_stack_ffffffffffffffbc >> 0x10);
  bVar2 = QMainWindowLayoutState::isValid((QMainWindowLayoutState *)0x5f6148);
  if ((bVar2) && (pQVar3 != (QLayoutItem *)0x0)) {
    in_stack_ffffffffffffffc0 = (QToolBarPrivate *)&in_RDI[0x3d].align;
    toDockPos(area_00);
    QToolBarAreaLayout::insertItem
              ((QToolBarAreaLayout *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               (DockPosition)((ulong)pQVar3 >> 0x20),in_RDI);
  }
  (*in_RDI->_vptr_QLayoutItem[0xe])();
  QToolBar::d_func((QToolBar *)0x5f6199);
  QToolBarPrivate::updateWindowFlags
            (in_stack_ffffffffffffffc0,SUB21((ushort)uVar4 >> 8,0),SUB21(uVar4,0));
  return;
}

Assistant:

void QMainWindowLayout::addToolBar(Qt::ToolBarArea area,
                                   QToolBar *toolbar,
                                   bool)
{
    area = validateToolBarArea(area);
    // let's add the toolbar to the layout
    addChildWidget(toolbar);
    QLayoutItem *item = layoutState.toolBarAreaLayout.addToolBar(toDockPos(area), toolbar);
    if (savedState.isValid() && item) {
        // copy the toolbar also in the saved state
        savedState.toolBarAreaLayout.insertItem(toDockPos(area), item);
    }
    invalidate();

    // this ensures that the toolbar has the right window flags (not floating any more)
    toolbar->d_func()->updateWindowFlags(false /*floating*/);
}